

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_template.hpp
# Opt level: O0

void boost::detail::function::
     void_function_obj_invoker1<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/test/impl/unit_test_parameters.ipp:134:24),_void,_boost::unit_test::basic_cstring<const_char>_>
     ::invoke(function_buffer *function_obj_ptr,basic_cstring<const_char> *a0)

{
  basic_cstring<const_char> *s;
  type *in_RSI;
  cstring *in_stack_00000008;
  functor_type *in_stack_00000010;
  functor_type *f;
  basic_cstring<const_char> local_28 [2];
  
  s = forward<boost::unit_test::basic_cstring<char_const>>(in_RSI);
  unit_test::basic_cstring<const_char>::basic_cstring(local_28,s);
  functor_manager_common<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/test/impl/unit_test_parameters.ipp:134:24)>
  ::functor_type::operator()(in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

static BOOST_FUNCTION_VOID_RETURN_TYPE
        invoke(function_buffer& function_obj_ptr BOOST_FUNCTION_COMMA
               BOOST_FUNCTION_PARMS)

        {
          FunctionObj* f;
          if (function_allows_small_object_optimization<FunctionObj>::value)
            f = reinterpret_cast<FunctionObj*>(function_obj_ptr.data);
          else
            f = reinterpret_cast<FunctionObj*>(function_obj_ptr.members.obj_ptr);
          BOOST_FUNCTION_RETURN((*f)(BOOST_FUNCTION_ARGS));
        }